

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<$_6::TEMPNAMEPLACEHOLDERVALUE(lest::env&)const::logic_t_const&>::operator()
          (result *__return_storage_ptr__,
          expression_lhs<__6::TEMPNAMEPLACEHOLDERVALUE(lest::env&)const::logic_t_const&> *this,
          logic_t *rhs)

{
  result *prVar1;
  int iVar2;
  ostream *poVar3;
  result *extraout_RAX;
  result *extraout_RAX_00;
  result *prVar4;
  logic_t *item;
  logic_t *item_00;
  ostringstream os;
  ulong *local_298;
  ulong local_288;
  undefined8 uStack_280;
  int local_274;
  ForNonContainerNonPointer<logic_t,_std::string> local_270;
  result *local_250;
  size_type local_248;
  undefined1 local_240 [16];
  result *local_230;
  undefined1 local_228 [16];
  pointer pcStack_218;
  ulong *local_210;
  ulong local_200;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  bool local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  ForNonContainerNonPointer<logic_t,_std::string> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_274 = rhs->value;
  iVar2 = *(int *)this;
  prVar1 = (result *)(local_228 + 8);
  local_230 = prVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"==","");
  local_250 = (result *)local_240;
  if (local_230 == prVar1) {
    local_240._8_8_ = pcStack_218;
  }
  else {
    local_250 = local_230;
  }
  local_240._1_7_ = local_228._9_7_;
  local_240[0] = local_228[8];
  local_248 = local_228._0_8_;
  local_228._0_8_ = 0;
  local_228[8] = '\0';
  local_230 = prVar1;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  lest::operator()(&local_270,(lest *)this,item);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_250->passed,local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  lest::operator()(&local_1c8,(lest *)rhs,item_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p == &local_270.field_2) {
    uStack_280 = local_270.field_2._8_8_;
    local_298 = &local_288;
  }
  else {
    local_298 = (ulong *)local_270._M_dataplus._M_p;
  }
  local_288 = local_270.field_2._M_allocated_capacity;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_298 == &local_288) {
    uStack_1f8 = (undefined4)uStack_280;
    uStack_1f4 = uStack_280._4_4_;
    local_298 = &local_200;
  }
  local_200 = local_288;
  local_1f0 = iVar2 == local_274;
  local_288 = local_288 & 0xffffffffffffff00;
  local_210 = local_298;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_298,(long)local_298 + local_270._M_string_length);
  __return_storage_ptr__->passed = local_1f0;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_1e8,local_1e0 + (long)local_1e8)
  ;
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  prVar4 = (result *)local_240;
  if (local_250 != prVar4) {
    operator_delete(local_250,local_240._0_8_ + 1);
    prVar4 = extraout_RAX;
  }
  if (local_230 != prVar1) {
    operator_delete(local_230,CONCAT71(local_228._9_7_,local_228[8]) + 1);
    prVar4 = extraout_RAX_00;
  }
  return prVar4;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }